

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_gains.hpp
# Opt level: O2

void __thiscall
ear::OutputGainMatVecT<float>::check_size(OutputGainMatVecT<float> *this,size_t rows,size_t cols)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  invalid_argument *piVar4;
  long lVar5;
  long *plVar6;
  allocator<char> local_39;
  string local_38;
  
  plVar6 = *(long **)this->mat;
  plVar2 = *(long **)(this->mat + 8);
  lVar3 = (long)plVar2 - (long)plVar6;
  lVar5 = lVar3 % 0x18;
  if (lVar3 / 0x18 != cols) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10,rows,lVar5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"incorrect number of cols in output matrix",&local_39);
    invalid_argument::invalid_argument(piVar4,&local_38);
    __cxa_throw(piVar4,&invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  do {
    if (plVar6 == plVar2) {
      return;
    }
    plVar1 = plVar6 + 1;
    lVar3 = *plVar6;
    plVar6 = plVar6 + 3;
  } while (*plVar1 - lVar3 >> 2 == rows);
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10,rows,lVar5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"incorrect number of rows in output matrix column",&local_39);
  invalid_argument::invalid_argument(piVar4,&local_38);
  __cxa_throw(piVar4,&invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

virtual void check_size(size_t rows, size_t cols) override {
      if (mat.size() != cols)
        throw invalid_argument("incorrect number of cols in output matrix");
      for (auto &col : mat)
        if (col.size() != rows)
          throw invalid_argument(
              "incorrect number of rows in output matrix column");
    }